

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_u8_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_int16 x_1;
  ma_uint64 i_1;
  ma_uint8 *src_u8_1;
  ma_int16 *dst_s16_1;
  ma_int16 x;
  ma_uint64 i;
  ma_uint8 *src_u8;
  ma_int16 *dst_s16;
  ma_dither_mode ditherMode_local;
  ma_uint64 count_local;
  void *src_local;
  void *dst_local;
  undefined8 local_38;
  
  for (local_38 = 0; local_38 < count; local_38 = local_38 + 1) {
    *(ushort *)((long)dst + local_38 * 2) = (*(byte *)((long)src + local_38) - 0x80) * 0x100;
  }
  return;
}

Assistant:

MA_API void ma_pcm_u8_to_s16(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_u8_to_s16__reference(dst, src, count, ditherMode);
#else
    #  if defined(MA_SUPPORT_SSE2)
        if (ma_has_sse2()) {
            ma_pcm_u8_to_s16__sse2(dst, src, count, ditherMode);
        } else
    #elif defined(MA_SUPPORT_NEON)
        if (ma_has_neon()) {
            ma_pcm_u8_to_s16__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_u8_to_s16__optimized(dst, src, count, ditherMode);
        }
#endif
}